

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::initFactorMatrix(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         **vec,
                  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *eps)

{
  U *pUVar1;
  Col *pCVar2;
  Dring *pDVar3;
  Dring *pDVar4;
  undefined8 *puVar5;
  uint *puVar6;
  byte bVar7;
  fpclass_type fVar8;
  int32_t iVar9;
  int *piVar10;
  int *piVar11;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar12;
  Dring *pDVar13;
  Dring *pDVar14;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar15;
  pointer pnVar16;
  bool bVar17;
  undefined8 uVar18;
  byte bVar19;
  int iVar20;
  int iVar21;
  long_long_type lVar22;
  uint uVar23;
  long lVar24;
  int iVar25;
  uint uVar26;
  long lVar27;
  long lVar28;
  Dring *pDVar29;
  Dring *pDVar30;
  byte bVar31;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  **ppSVar32;
  ulong i;
  long lVar33;
  cpp_dec_float<100U,_int,_void> vv;
  int local_364;
  cpp_dec_float<100U,_int,_void> local_358;
  ulong local_300;
  uint local_2f8 [18];
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  **local_2b0;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  uint local_278 [3];
  undefined3 uStack_26b;
  int iStack_268;
  bool bStack_264;
  undefined8 local_260;
  uint *local_250;
  cpp_dec_float<100U,_int,_void> *local_248;
  int *local_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 uStack_218;
  uint uStack_210;
  uint local_20c;
  uint uStack_208;
  uint auStack_204 [3];
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  uint auStack_1c0 [2];
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  uint auStack_180 [2];
  cpp_dec_float<100U,_int,_void> local_178;
  cpp_dec_float<100U,_int,_void> local_128;
  cpp_dec_float<100U,_int,_void> local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_80;
  
  local_2f8[0xc] = 0;
  local_2f8[0xd] = 0;
  local_2f8[0xe] = 0;
  local_2f8[8] = 0;
  local_2f8[9] = 0;
  local_2f8[10] = 0;
  local_2f8[0xb] = 0;
  local_2f8[4] = 0;
  local_2f8[5] = 0;
  local_2f8[6] = 0;
  local_2f8[7] = 0;
  local_2f8[0] = 0;
  local_2f8[1] = 0;
  local_2f8[2] = 0;
  local_2f8[3] = 0;
  local_240 = (this->temp).s_mark;
  if (0 < this->thedim) {
    piVar10 = (this->u).row.len;
    piVar11 = (this->u).row.max;
    lVar27 = 0;
    do {
      piVar10[lVar27] = 0;
      piVar11[lVar27] = 0;
      lVar27 = lVar27 + 1;
    } while (lVar27 < this->thedim);
  }
  i = 0;
  if (0 < this->thedim) {
    piVar10 = (this->u).row.max;
    lVar27 = 0;
    do {
      iVar25 = vec[lVar27]->memused;
      if ((long)iVar25 < 2) {
        if (iVar25 == 0) {
          this->stat = SINGULAR;
          return;
        }
      }
      else {
        pNVar12 = vec[lVar27]->m_elem;
        lVar28 = 0;
        do {
          piVar11 = piVar10 + *(int *)((long)(&pNVar12->val + 1) + lVar28);
          *piVar11 = *piVar11 + 1;
          lVar28 = lVar28 + 0x54;
        } while ((long)iVar25 * 0x54 - lVar28 != 0);
        i = (ulong)(uint)(iVar25 + (int)i);
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 < this->thedim);
    i = (ulong)(int)i;
  }
  local_260._0_4_ = cpp_dec_float_finite;
  local_260._4_4_ = 0x10;
  local_2a8 = (undefined1  [16])0x0;
  local_298 = (undefined1  [16])0x0;
  local_288 = (undefined1  [16])0x0;
  local_278[0] = 0;
  local_278[1] = 0;
  stack0xfffffffffffffd90 = 0;
  uStack_26b = 0;
  iStack_268 = 0;
  bStack_264 = false;
  local_2b0 = vec;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (&local_358,i,(type *)0x0);
  if ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
       *)local_2a8 != &this->rowMemMult) {
    local_2a8 = *(undefined1 (*) [16])(this->rowMemMult).m_backend.data._M_elems;
    local_298 = *(undefined1 (*) [16])((this->rowMemMult).m_backend.data._M_elems + 4);
    local_288 = *(undefined1 (*) [16])((this->rowMemMult).m_backend.data._M_elems + 8);
    local_278._0_8_ = *(undefined8 *)((this->rowMemMult).m_backend.data._M_elems + 0xc);
    uVar18 = *(undefined8 *)((this->rowMemMult).m_backend.data._M_elems + 0xe);
    stack0xfffffffffffffd90 = (undefined5)uVar18;
    uStack_26b = (undefined3)((ulong)uVar18 >> 0x28);
    iStack_268 = (this->rowMemMult).m_backend.exp;
    bStack_264 = (this->rowMemMult).m_backend.neg;
    local_260._0_4_ = (this->rowMemMult).m_backend.fpclass;
    local_260._4_4_ = (this->rowMemMult).m_backend.prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
            ((cpp_dec_float<100U,_int,_void> *)local_2a8,&local_358);
  lVar27 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::extract_signed_long_long
                     ((cpp_dec_float<100U,_int,_void> *)local_2a8);
  if (lVar27 < -0x7fffffff) {
    lVar27 = -0x80000000;
  }
  if (0x7ffffffe < lVar27) {
    lVar27 = 0x7fffffff;
  }
  minRowMem(this,(int)lVar27);
  local_260._0_4_ = cpp_dec_float_finite;
  local_260._4_4_ = 0x10;
  local_2a8 = (undefined1  [16])0x0;
  local_298 = (undefined1  [16])0x0;
  local_288 = (undefined1  [16])0x0;
  local_278[0] = 0;
  local_278[1] = 0;
  stack0xfffffffffffffd90 = 0;
  uStack_26b = 0;
  iStack_268 = 0;
  bStack_264 = false;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (&local_358,i,(type *)0x0);
  if ((cpp_dec_float<100U,_int,_void> *)local_2a8 != &(this->colMemMult).m_backend) {
    local_2a8 = *(undefined1 (*) [16])(this->colMemMult).m_backend.data._M_elems;
    local_298 = *(undefined1 (*) [16])((this->colMemMult).m_backend.data._M_elems + 4);
    local_288 = *(undefined1 (*) [16])((this->colMemMult).m_backend.data._M_elems + 8);
    local_278._0_8_ = *(undefined8 *)((this->colMemMult).m_backend.data._M_elems + 0xc);
    uVar18 = *(undefined8 *)((this->colMemMult).m_backend.data._M_elems + 0xe);
    stack0xfffffffffffffd90 = (undefined5)uVar18;
    uStack_26b = (undefined3)((ulong)uVar18 >> 0x28);
    iStack_268 = (this->colMemMult).m_backend.exp;
    bStack_264 = (this->colMemMult).m_backend.neg;
    local_260._0_4_ = (this->colMemMult).m_backend.fpclass;
    local_260._4_4_ = (this->colMemMult).m_backend.prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
            ((cpp_dec_float<100U,_int,_void> *)local_2a8,&local_358);
  lVar22 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::extract_signed_long_long
                     ((cpp_dec_float<100U,_int,_void> *)local_2a8);
  lVar27 = -0x80000000;
  if (-0x80000000 < lVar22) {
    lVar27 = lVar22;
  }
  if (0x7ffffffe < lVar27) {
    lVar27 = 0x7fffffff;
  }
  iVar25 = (int)lVar27;
  if ((this->u).col.size < iVar25) {
    (this->u).col.size = iVar25;
    spx_realloc<int*>(&(this->u).col.idx,iVar25);
  }
  local_260._0_4_ = cpp_dec_float_finite;
  local_260._4_4_ = 0x10;
  local_2a8 = (undefined1  [16])0x0;
  local_298 = (undefined1  [16])0x0;
  local_288 = (undefined1  [16])0x0;
  local_278[0] = 0;
  local_278[1] = 0;
  stack0xfffffffffffffd90 = 0;
  uStack_26b = 0;
  iStack_268 = 0;
  bStack_264 = false;
  iVar25 = 0;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (&local_358,i,(type *)0x0);
  if ((cpp_dec_float<100U,_int,_void> *)local_2a8 != &(this->lMemMult).m_backend) {
    local_2a8 = *(undefined1 (*) [16])(this->lMemMult).m_backend.data._M_elems;
    local_298 = *(undefined1 (*) [16])((this->lMemMult).m_backend.data._M_elems + 4);
    local_288 = *(undefined1 (*) [16])((this->lMemMult).m_backend.data._M_elems + 8);
    local_278._0_8_ = *(undefined8 *)((this->lMemMult).m_backend.data._M_elems + 0xc);
    uVar18 = *(undefined8 *)((this->lMemMult).m_backend.data._M_elems + 0xe);
    stack0xfffffffffffffd90 = (undefined5)uVar18;
    uStack_26b = (undefined3)((ulong)uVar18 >> 0x28);
    iStack_268 = (this->lMemMult).m_backend.exp;
    bStack_264 = (this->lMemMult).m_backend.neg;
    local_260._0_4_ = (this->lMemMult).m_backend.fpclass;
    local_260._4_4_ = (this->lMemMult).m_backend.prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
            ((cpp_dec_float<100U,_int,_void> *)local_2a8,&local_358);
  lVar22 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::extract_signed_long_long
                     ((cpp_dec_float<100U,_int,_void> *)local_2a8);
  lVar27 = -0x80000000;
  if (-0x80000000 < lVar22) {
    lVar27 = lVar22;
  }
  if (0x7ffffffe < lVar27) {
    lVar27 = 0x7fffffff;
  }
  minLMem(this,(int)lVar27);
  pUVar1 = &this->u;
  piVar10 = (this->u).row.start;
  *piVar10 = 0;
  pDVar13 = (this->u).row.elem;
  iVar20 = this->thedim;
  (this->u).row.list.idx = iVar20;
  (this->u).row.list.next = pDVar13;
  pCVar2 = &(this->u).col;
  pDVar14 = (this->u).col.elem;
  (this->u).col.list.idx = iVar20;
  (this->u).col.list.next = pDVar14;
  pDVar29 = &pCVar2->list;
  pDVar30 = (Dring *)pUVar1;
  if (0 < iVar20) {
    piVar11 = (this->u).row.max;
    lVar28 = 0;
    iVar25 = 0;
    lVar27 = 0;
    pDVar29 = (Dring *)pUVar1;
    pDVar30 = &pCVar2->list;
    do {
      lVar33 = lVar27;
      pDVar3 = (Dring *)((long)&pDVar13->next + lVar33);
      pDVar4 = (Dring *)((long)&pDVar14->next + lVar33);
      piVar10[lVar28] = iVar25;
      iVar25 = iVar25 + piVar11[lVar28];
      *(int *)((long)&pDVar13->idx + lVar33) = (int)lVar28;
      *(Dring **)((long)&pDVar13->prev + lVar33) = pDVar29;
      (((Row *)&pDVar29->next)->list).next = pDVar3;
      *(int *)((long)&pDVar14->idx + lVar33) = (int)lVar28;
      *(Dring **)((long)&pDVar14->prev + lVar33) = pDVar30;
      ((Dring *)&pDVar30->next)->next = pDVar4;
      lVar28 = lVar28 + 1;
      iVar20 = this->thedim;
      lVar27 = lVar33 + 0x18;
      pDVar29 = pDVar3;
      pDVar30 = pDVar4;
    } while (lVar28 < iVar20);
    pDVar30 = (Dring *)((long)&pDVar13->next + lVar33);
    pDVar29 = (Dring *)((long)&pDVar14->next + lVar33);
  }
  piVar10[iVar20] = 0;
  (this->u).row.max[this->thedim] = 0;
  (this->u).row.used = iVar25;
  (((Row *)&pDVar30->next)->list).next = (Dring *)pUVar1;
  (this->u).row.list.prev = pDVar30;
  ((Dring *)&pDVar29->next)->next = &pCVar2->list;
  (this->u).col.list.prev = pDVar29;
  (this->temp).stage = 0;
  local_248 = &(this->initMaxabs).m_backend;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(local_248,0);
  bVar17 = 0 < this->thedim;
  local_300 = 0;
  if (0 < this->thedim) {
    local_250 = (this->initMaxabs).m_backend.data._M_elems + 1;
    lVar27 = 0;
    local_300 = 0;
    ppSVar32 = local_2b0;
    do {
      pSVar15 = ppSVar32[lVar27];
      (this->u).col.start[lVar27] = (int)local_300;
      uVar26 = 0;
      if (0 < pSVar15->memused) {
        uVar26 = 0;
        lVar33 = 0x48;
        lVar28 = 1;
        do {
          pNVar12 = pSVar15->m_elem;
          puVar5 = (undefined8 *)((long)(pNVar12->val).m_backend.data._M_elems + lVar33 + -0x48);
          local_1b8 = *puVar5;
          uStack_1b0 = puVar5[1];
          puVar5 = (undefined8 *)((long)(pNVar12->val).m_backend.data._M_elems + lVar33 + -0x38);
          local_1a8 = *puVar5;
          uStack_1a0 = puVar5[1];
          puVar5 = (undefined8 *)((long)(pNVar12->val).m_backend.data._M_elems + lVar33 + -0x28);
          local_198 = *puVar5;
          uStack_190 = puVar5[1];
          puVar5 = (undefined8 *)((long)(pNVar12->val).m_backend.data._M_elems + lVar33 + -0x18);
          local_188 = *puVar5;
          local_358.data._M_elems._56_8_ = puVar5[1];
          local_358.exp = *(int *)((long)(pNVar12->val).m_backend.data._M_elems + lVar33 + -8);
          local_358.neg = *(bool *)((long)(pNVar12->val).m_backend.data._M_elems + lVar33 + -4);
          local_358._72_8_ = *(undefined8 *)((long)(pNVar12->val).m_backend.data._M_elems + lVar33);
          local_d8.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
          local_d8.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
          local_d8.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
          local_d8.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
          local_d8.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
          local_d8.data._M_elems._40_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 10);
          local_d8.data._M_elems._48_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
          local_d8.data._M_elems._56_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
          local_d8.exp = (eps->m_backend).exp;
          local_d8.neg = (eps->m_backend).neg;
          local_d8.fpclass = (eps->m_backend).fpclass;
          local_d8.prec_elem = (eps->m_backend).prec_elem;
          local_358.data._M_elems[0xc] = (uint)local_188;
          local_358.data._M_elems[0xd] = (uint)((ulong)local_188 >> 0x20);
          local_358.data._M_elems[8] = (uint)local_198;
          local_358.data._M_elems[9] = (uint)((ulong)local_198 >> 0x20);
          local_358.data._M_elems[10] = (uint)uStack_190;
          local_358.data._M_elems[0xb] = (uint)((ulong)uStack_190 >> 0x20);
          local_358.data._M_elems[4] = (uint)local_1a8;
          local_358.data._M_elems[5] = (uint)((ulong)local_1a8 >> 0x20);
          local_358.data._M_elems[6] = (uint)uStack_1a0;
          local_358.data._M_elems[7] = (uint)((ulong)uStack_1a0 >> 0x20);
          local_358.data._M_elems[0] = (uint)local_1b8;
          local_358.data._M_elems[1] = (uint)((ulong)local_1b8 >> 0x20);
          local_358.data._M_elems[2] = (uint)uStack_1b0;
          local_358.data._M_elems[3] = (uint)((ulong)uStack_1b0 >> 0x20);
          if ((local_358.neg == true) &&
             (local_358.data._M_elems[0] != 0 || local_358.fpclass != cpp_dec_float_finite)) {
            local_358.neg = false;
          }
          uVar23 = 0;
          auStack_180 = (uint  [2])local_358.data._M_elems._56_8_;
          if (local_d8.fpclass != cpp_dec_float_NaN && local_358.fpclass != cpp_dec_float_NaN) {
            iVar25 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               (&local_358,&local_d8);
            uVar23 = (uint)(0 < iVar25);
          }
          uVar26 = uVar26 + uVar23;
          if (pSVar15->memused <= lVar28) break;
          lVar33 = lVar33 + 0x54;
          lVar28 = lVar28 + 1;
        } while (uVar26 < 2);
      }
      if (uVar26 == 0) {
        this->stat = SINGULAR;
        bVar31 = 0;
      }
      else {
        iVar25 = (int)lVar27;
        if (uVar26 == 1) {
          lVar28 = 0;
          do {
            lVar33 = lVar28;
            pNVar12 = pSVar15->m_elem;
            puVar5 = (undefined8 *)((long)(pNVar12->val).m_backend.data._M_elems + lVar33);
            local_1f8 = *puVar5;
            uStack_1f0 = puVar5[1];
            puVar5 = (undefined8 *)((long)(pNVar12->val).m_backend.data._M_elems + lVar33 + 0x10);
            local_1e8 = *puVar5;
            uStack_1e0 = puVar5[1];
            puVar5 = (undefined8 *)((long)(pNVar12->val).m_backend.data._M_elems + lVar33 + 0x20);
            local_1d8 = *puVar5;
            uStack_1d0 = puVar5[1];
            puVar5 = (undefined8 *)((long)(pNVar12->val).m_backend.data._M_elems + lVar33 + 0x30);
            local_1c8 = *puVar5;
            local_358.data._M_elems._56_8_ = puVar5[1];
            local_358.exp = *(int *)((long)(&(pNVar12->val).m_backend.data + 1) + lVar33);
            local_358.neg = *(bool *)((long)(&(pNVar12->val).m_backend.data + 1) + lVar33 + 4);
            local_358._72_8_ =
                 *(undefined8 *)((long)(&(pNVar12->val).m_backend.data + 1) + lVar33 + 8);
            local_128.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
            local_128.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
            local_128.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
            local_128.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
            local_128.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
            local_128.data._M_elems._40_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 10);
            local_128.data._M_elems._48_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
            local_128.data._M_elems._56_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
            local_128.exp = (eps->m_backend).exp;
            local_128.neg = (eps->m_backend).neg;
            local_128.fpclass = (eps->m_backend).fpclass;
            local_128.prec_elem = (eps->m_backend).prec_elem;
            local_358.data._M_elems[0xc] = (uint)local_1c8;
            local_358.data._M_elems[0xd] = (uint)((ulong)local_1c8 >> 0x20);
            local_358.data._M_elems[8] = (uint)local_1d8;
            local_358.data._M_elems[9] = (uint)((ulong)local_1d8 >> 0x20);
            local_358.data._M_elems[10] = (uint)uStack_1d0;
            local_358.data._M_elems[0xb] = (uint)((ulong)uStack_1d0 >> 0x20);
            local_358.data._M_elems[4] = (uint)local_1e8;
            local_358.data._M_elems[5] = (uint)((ulong)local_1e8 >> 0x20);
            local_358.data._M_elems[6] = (uint)uStack_1e0;
            local_358.data._M_elems[7] = (uint)((ulong)uStack_1e0 >> 0x20);
            local_358.data._M_elems[0] = (uint)local_1f8;
            local_358.data._M_elems[1] = (uint)((ulong)local_1f8 >> 0x20);
            local_358.data._M_elems[2] = (uint)uStack_1f0;
            local_358.data._M_elems[3] = (uint)((ulong)uStack_1f0 >> 0x20);
            if ((local_358.neg == true) &&
               (local_358.data._M_elems[0] != 0 || local_358.fpclass != cpp_dec_float_finite)) {
              local_358.neg = false;
            }
            auStack_1c0 = (uint  [2])local_358.data._M_elems._56_8_;
            if ((local_358.fpclass == cpp_dec_float_NaN) || (local_128.fpclass == cpp_dec_float_NaN)
               ) break;
            iVar20 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               (&local_358,&local_128);
            lVar28 = lVar33 + 0x54;
          } while (iVar20 < 1);
          pNVar12 = pSVar15->m_elem;
          iVar20 = (this->row).perm[*(int *)((long)(&pNVar12->val + 1) + lVar33)];
          bVar7 = (byte)((uint)iVar20 >> 0x18);
          bVar31 = bVar7 >> 7;
          if (iVar20 < 0) {
            uVar26 = *(uint *)((long)(pNVar12->val).m_backend.data._M_elems + lVar33);
            puVar5 = (undefined8 *)((long)(pNVar12->val).m_backend.data._M_elems + lVar33 + 0x30);
            local_358.data._M_elems._56_8_ = puVar5[1];
            local_2f8[0xc] = (uint)((ulong)*puVar5 >> 0x20);
            puVar6 = (uint *)((long)(pNVar12->val).m_backend.data._M_elems + lVar33 + 0x24);
            local_2f8._32_8_ = *(undefined8 *)puVar6;
            uVar18 = *(undefined8 *)(puVar6 + 2);
            local_2f8[10] = (uint)uVar18;
            local_2f8[0xb] = (uint)((ulong)uVar18 >> 0x20);
            puVar6 = (uint *)((long)(pNVar12->val).m_backend.data._M_elems + lVar33 + 0x14);
            local_2f8._16_8_ = *(undefined8 *)puVar6;
            local_2f8._24_8_ = *(undefined8 *)(puVar6 + 2);
            puVar6 = (uint *)((long)(pNVar12->val).m_backend.data._M_elems + lVar33 + 4);
            local_2f8._0_8_ = *(undefined8 *)puVar6;
            local_2f8._8_8_ = *(undefined8 *)(puVar6 + 2);
            iVar20 = *(int *)((long)(&(pNVar12->val).m_backend.data + 1) + lVar33);
            bVar7 = *(byte *)((long)(&(pNVar12->val).m_backend.data + 1) + lVar33 + 4);
            fVar8 = *(fpclass_type *)((long)(&(pNVar12->val).m_backend.data + 1) + lVar33 + 8);
            iVar9 = *(int32_t *)((long)(&(pNVar12->val).m_backend.data + 1) + lVar33 + 0xc);
            local_358.data._M_elems[0xd] = local_2f8[0xc];
            local_358.data._M_elems[9] = (uint)local_2f8._32_8_;
            local_358.data._M_elems[10] = SUB84(local_2f8._32_8_,4);
            local_358.data._M_elems[5] = (uint)local_2f8._16_8_;
            local_358.data._M_elems[6] = SUB84(local_2f8._16_8_,4);
            local_358.data._M_elems[7] = (uint)local_2f8._24_8_;
            local_358.data._M_elems[8] = SUB84(local_2f8._24_8_,4);
            local_358.data._M_elems[1] = (uint)local_2f8._0_8_;
            local_358.data._M_elems[2] = SUB84(local_2f8._0_8_,4);
            local_358.data._M_elems[3] = (uint)local_2f8._8_8_;
            local_358.data._M_elems[4] = SUB84(local_2f8._8_8_,4);
            local_358.prec_elem = iVar9;
            local_358.fpclass = fVar8;
            local_358.neg = (bool)bVar7;
            if ((bVar7 == 1) && (fVar8 != cpp_dec_float_finite || uVar26 != 0)) {
              local_358.neg = false;
            }
            local_358.data._M_elems[0] = uVar26;
            local_358.data._M_elems[0xb] = local_2f8[10];
            local_358.data._M_elems[0xc] = local_2f8[0xb];
            local_358.exp = iVar20;
            local_2f8._52_8_ = local_358.data._M_elems._56_8_;
            if (((fVar8 != cpp_dec_float_NaN) &&
                ((this->initMaxabs).m_backend.fpclass != cpp_dec_float_NaN)) &&
               (iVar21 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (&local_358,local_248), 0 < iVar21)) {
              bVar19 = bVar7;
              if (bVar7 != 0) {
                bVar19 = (fVar8 != cpp_dec_float_finite || uVar26 != 0) ^ bVar7;
              }
              (this->initMaxabs).m_backend.data._M_elems[0] = uVar26;
              *(ulong *)(local_250 + 0xb) = CONCAT44(local_2f8[0xc],local_2f8[0xb]);
              *(undefined8 *)(local_250 + 0xd) = local_2f8._52_8_;
              *(undefined8 *)(local_250 + 8) = local_2f8._32_8_;
              *(ulong *)(local_250 + 10) = CONCAT44(local_2f8[0xb],local_2f8[10]);
              *(undefined8 *)(local_250 + 4) = local_2f8._16_8_;
              *(undefined8 *)(local_250 + 6) = local_2f8._24_8_;
              *(undefined8 *)local_250 = local_2f8._0_8_;
              *(undefined8 *)(local_250 + 2) = local_2f8._8_8_;
              (this->initMaxabs).m_backend.exp = iVar20;
              (this->initMaxabs).m_backend.neg = (bool)bVar19;
              (this->initMaxabs).m_backend.fpclass = fVar8;
              (this->initMaxabs).m_backend.prec_elem = iVar9;
            }
            local_80.m_backend.data._M_elems[0xd] = local_2f8[0xc];
            local_80.m_backend.data._M_elems[0xe] = local_2f8[0xd];
            local_80.m_backend.data._M_elems[0xf] = local_2f8[0xe];
            local_80.m_backend.data._M_elems[9] = local_2f8[8];
            local_80.m_backend.data._M_elems[10] = local_2f8[9];
            local_80.m_backend.data._M_elems[0xb] = local_2f8[10];
            local_80.m_backend.data._M_elems[0xc] = local_2f8[0xb];
            local_80.m_backend.data._M_elems[5] = local_2f8[4];
            local_80.m_backend.data._M_elems[6] = local_2f8[5];
            local_80.m_backend.data._M_elems[7] = local_2f8[6];
            local_80.m_backend.data._M_elems[8] = local_2f8[7];
            local_80.m_backend.data._M_elems[1] = local_2f8[0];
            local_80.m_backend.data._M_elems[2] = local_2f8[1];
            local_80.m_backend.data._M_elems[3] = local_2f8[2];
            local_80.m_backend.data._M_elems[4] = local_2f8[3];
            local_80.m_backend.data._M_elems[0] = uVar26;
            local_80.m_backend.exp = iVar20;
            local_80.m_backend.neg = (bool)bVar7;
            local_80.m_backend.fpclass = fVar8;
            local_80.m_backend.prec_elem = iVar9;
            setPivot(this,(this->temp).stage,iVar25,
                     *(int *)((long)(&pSVar15->m_elem->val + 1) + lVar33),&local_80);
            local_240[(this->temp).stage] = iVar25;
            piVar10 = &(this->temp).stage;
            *piVar10 = *piVar10 + 1;
            (this->u).col.max[lVar27] = 0;
            (this->u).col.len[lVar27] = 0;
            (this->temp).s_cact[lVar27] = 0;
            ppSVar32 = local_2b0;
          }
          else {
            this->stat = SINGULAR;
            bVar31 = bVar7 >> 7;
          }
        }
        else {
          if (pSVar15->memused < 1) {
            local_364 = 0;
          }
          else {
            lVar33 = 0;
            lVar28 = 0;
            local_364 = 0;
            do {
              pNVar12 = pSVar15->m_elem;
              uVar26 = *(uint *)((long)(pNVar12->val).m_backend.data._M_elems + lVar33);
              puVar5 = (undefined8 *)((long)(pNVar12->val).m_backend.data._M_elems + lVar33 + 0x30);
              local_2f8._52_8_ = puVar5[1];
              local_2f8[0xc] = (uint)((ulong)*puVar5 >> 0x20);
              puVar6 = (uint *)((long)(pNVar12->val).m_backend.data._M_elems + lVar33 + 0x24);
              local_2f8._32_8_ = *(undefined8 *)puVar6;
              uVar18 = *(undefined8 *)(puVar6 + 2);
              local_2f8[10] = (uint)uVar18;
              local_2f8[0xb] = (uint)((ulong)uVar18 >> 0x20);
              puVar6 = (uint *)((long)(pNVar12->val).m_backend.data._M_elems + lVar33 + 0x14);
              local_2f8._16_8_ = *(undefined8 *)puVar6;
              local_2f8._24_8_ = *(undefined8 *)(puVar6 + 2);
              puVar6 = (uint *)((long)(pNVar12->val).m_backend.data._M_elems + lVar33 + 4);
              local_2f8._0_8_ = *(undefined8 *)puVar6;
              local_2f8._8_8_ = *(undefined8 *)(puVar6 + 2);
              iVar20 = *(int *)((long)(&(pNVar12->val).m_backend.data + 1) + lVar33);
              bVar31 = *(byte *)((long)(&(pNVar12->val).m_backend.data + 1) + lVar33 + 4);
              fVar8 = *(fpclass_type *)((long)(&(pNVar12->val).m_backend.data + 1) + lVar33 + 8);
              iVar9 = *(int32_t *)((long)(&(pNVar12->val).m_backend.data + 1) + lVar33 + 0xc);
              puVar5 = (undefined8 *)((long)(pNVar12->val).m_backend.data._M_elems + lVar33 + 4);
              local_238 = *puVar5;
              uStack_230 = puVar5[1];
              puVar5 = (undefined8 *)((long)(pNVar12->val).m_backend.data._M_elems + lVar33 + 0x14);
              local_228 = *puVar5;
              uStack_220 = puVar5[1];
              puVar5 = (undefined8 *)((long)(pNVar12->val).m_backend.data._M_elems + lVar33 + 0x24);
              uStack_218 = *puVar5;
              uVar18 = puVar5[1];
              puVar5 = (undefined8 *)((long)(pNVar12->val).m_backend.data._M_elems + lVar33 + 0x30);
              local_358.data._M_elems._56_8_ = puVar5[1];
              uStack_208 = (uint)((ulong)*puVar5 >> 0x20);
              uStack_210 = (uint)uVar18;
              local_20c = (uint)((ulong)uVar18 >> 0x20);
              local_178.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
              local_178.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
              local_178.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
              local_178.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
              local_178.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
              local_178.data._M_elems._40_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 10);
              local_178.data._M_elems._48_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xc)
              ;
              local_178.data._M_elems._56_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xe)
              ;
              local_178.exp = (eps->m_backend).exp;
              local_178.neg = (eps->m_backend).neg;
              local_178.fpclass = (eps->m_backend).fpclass;
              local_178.prec_elem = (eps->m_backend).prec_elem;
              local_358.data._M_elems[0xd] = uStack_208;
              local_358.data._M_elems[9] = (uint)uStack_218;
              local_358.data._M_elems[10] = (uint)((ulong)uStack_218 >> 0x20);
              local_358.data._M_elems[5] = (uint)local_228;
              local_358.data._M_elems[6] = (uint)((ulong)local_228 >> 0x20);
              local_358.data._M_elems[7] = (uint)uStack_220;
              local_358.data._M_elems[8] = (uint)((ulong)uStack_220 >> 0x20);
              local_358.data._M_elems[1] = (uint)local_238;
              local_358.data._M_elems[2] = (uint)((ulong)local_238 >> 0x20);
              local_358.data._M_elems[3] = (uint)uStack_230;
              local_358.data._M_elems[4] = (uint)((ulong)uStack_230 >> 0x20);
              local_358.prec_elem = iVar9;
              local_358.fpclass = fVar8;
              local_358.neg = (bool)bVar31;
              if (((bool)bVar31 == true) && (fVar8 != cpp_dec_float_finite || uVar26 != 0)) {
                local_358.neg = false;
              }
              auStack_204._0_8_ = local_358.data._M_elems._56_8_;
              if ((local_178.fpclass != cpp_dec_float_NaN && fVar8 != cpp_dec_float_NaN) &&
                 (local_358.data._M_elems[0] = uVar26, local_358.data._M_elems[0xb] = uStack_210,
                 local_358.data._M_elems[0xc] = local_20c, local_358.exp = iVar20,
                 iVar21 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                    (&local_358,&local_178), 0 < iVar21)) {
                iVar21 = *(int *)((long)(&pSVar15->m_elem->val + 1) + lVar33);
                (this->u).col.idx[(int)local_300] = iVar21;
                lVar24 = (long)(this->u).row.len[iVar21] + (long)(this->u).row.start[iVar21];
                (this->u).row.idx[lVar24] = iVar25;
                pnVar16 = (this->u).row.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pnVar16[lVar24].m_backend.data._M_elems[0] = uVar26;
                puVar6 = (uint *)((long)pnVar16[lVar24].m_backend.data._M_elems + 4);
                *(undefined8 *)puVar6 = local_2f8._0_8_;
                *(undefined8 *)(puVar6 + 2) = local_2f8._8_8_;
                puVar6 = (uint *)((long)pnVar16[lVar24].m_backend.data._M_elems + 0x14);
                *(undefined8 *)puVar6 = local_2f8._16_8_;
                *(undefined8 *)(puVar6 + 2) = local_2f8._24_8_;
                puVar6 = (uint *)((long)pnVar16[lVar24].m_backend.data._M_elems + 0x24);
                *(undefined8 *)puVar6 = local_2f8._32_8_;
                *(ulong *)(puVar6 + 2) = CONCAT44(local_2f8[0xb],local_2f8[10]);
                puVar6 = (uint *)((long)pnVar16[lVar24].m_backend.data._M_elems + 0x30);
                *(ulong *)puVar6 = CONCAT44(local_2f8[0xc],local_2f8[0xb]);
                *(undefined8 *)(puVar6 + 2) = local_2f8._52_8_;
                pnVar16[lVar24].m_backend.exp = iVar20;
                pnVar16[lVar24].m_backend.neg = (bool)bVar31;
                pnVar16[lVar24].m_backend.fpclass = fVar8;
                pnVar16[lVar24].m_backend.prec_elem = iVar9;
                piVar10 = (this->u).row.len + iVar21;
                *piVar10 = *piVar10 + 1;
                local_358.data._M_elems[0xd] = local_2f8[0xc];
                local_358.data._M_elems[0xe] = local_2f8[0xd];
                local_358.data._M_elems[0xf] = local_2f8[0xe];
                local_358.data._M_elems[9] = (uint)local_2f8._32_8_;
                local_358.data._M_elems[10] = SUB84(local_2f8._32_8_,4);
                local_358.data._M_elems[0xb] = local_2f8[10];
                local_358.data._M_elems[0xc] = local_2f8[0xb];
                local_358.data._M_elems[5] = (uint)local_2f8._16_8_;
                local_358.data._M_elems[6] = SUB84(local_2f8._16_8_,4);
                local_358.data._M_elems[7] = (uint)local_2f8._24_8_;
                local_358.data._M_elems[8] = SUB84(local_2f8._24_8_,4);
                local_358.data._M_elems[1] = (uint)local_2f8._0_8_;
                local_358.data._M_elems[2] = SUB84(local_2f8._0_8_,4);
                local_358.data._M_elems[3] = (uint)local_2f8._8_8_;
                local_358.data._M_elems[4] = SUB84(local_2f8._8_8_,4);
                local_358.neg = (bool)bVar31;
                if (((bool)bVar31 != false) && (fVar8 != cpp_dec_float_finite || uVar26 != 0)) {
                  local_358.neg = (bool)(bVar31 ^ 1);
                }
                if (((fVar8 != cpp_dec_float_NaN) &&
                    ((this->initMaxabs).m_backend.fpclass != cpp_dec_float_NaN)) &&
                   (local_358.data._M_elems[0] = uVar26, local_358.exp = iVar20,
                   iVar21 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                      (&local_358,local_248), 0 < iVar21)) {
                  if ((bool)bVar31 != false) {
                    bVar31 = bVar31 ^ (fVar8 != cpp_dec_float_finite || uVar26 != 0);
                  }
                  (this->initMaxabs).m_backend.data._M_elems[0] = uVar26;
                  *(ulong *)(local_250 + 0xb) = CONCAT44(local_2f8[0xc],local_2f8[0xb]);
                  *(undefined8 *)(local_250 + 0xd) = local_2f8._52_8_;
                  *(undefined8 *)(local_250 + 8) = local_2f8._32_8_;
                  *(ulong *)(local_250 + 10) = CONCAT44(local_2f8[0xb],local_2f8[10]);
                  *(undefined8 *)(local_250 + 4) = local_2f8._16_8_;
                  *(undefined8 *)(local_250 + 6) = local_2f8._24_8_;
                  *(undefined8 *)local_250 = local_2f8._0_8_;
                  *(undefined8 *)(local_250 + 2) = local_2f8._8_8_;
                  (this->initMaxabs).m_backend.exp = iVar20;
                  (this->initMaxabs).m_backend.neg = (bool)bVar31;
                  (this->initMaxabs).m_backend.fpclass = fVar8;
                  (this->initMaxabs).m_backend.prec_elem = iVar9;
                }
                local_300 = (ulong)((int)local_300 + 1);
                local_364 = local_364 + 1;
              }
              lVar28 = lVar28 + 1;
              lVar33 = lVar33 + 0x54;
            } while (lVar28 < pSVar15->memused);
          }
          (this->u).col.max[lVar27] = local_364;
          (this->u).col.len[lVar27] = local_364;
          (this->temp).s_cact[lVar27] = local_364;
          bVar31 = 1;
          ppSVar32 = local_2b0;
        }
      }
      if (bVar31 == 0) break;
      lVar27 = lVar27 + 1;
      bVar17 = lVar27 < this->thedim;
    } while (lVar27 < this->thedim);
  }
  if (!bVar17) {
    (this->u).col.used = (int)local_300;
  }
  return;
}

Assistant:

void CLUFactor<R>::initFactorMatrix(const SVectorBase<R>** vec, const R eps)
{

   R x;
   int m;
   int tot;
   Dring* rring, *lastrring;
   Dring* cring, *lastcring;
   const SVectorBase<R>* psv;
   int* sing = temp.s_mark;

   /*  Initialize:
    *  - column file thereby remembering column singletons in |sing|.
    *  - nonzeros counts per row
    *  - total number of nonzeros
    */

   for(int i = 0; i < thedim; i++)
      u.row.max[i] = u.row.len[i] = 0;

   tot = 0;

   for(int i = 0; i < thedim; i++)
   {
      int k;

      psv = vec[i];
      k = psv->size();

      if(k > 1)
      {
         tot += k;

         for(int j = 0; j < k; ++j)
            u.row.max[psv->index(j)]++;
      }
      else if(k == 0)
      {
         this->stat = SLinSolver<R>::SINGULAR;
         return;
      }
   }

   /*  Resize nonzero memory if necessary
    */
   minRowMem(int(rowMemMult * tot));

   minColMem(int(colMemMult * tot));

   minLMem(int(lMemMult * tot));


   /*  Initialize:
    *  - row ring lists
    *  - row vectors in file
    *  - column ring lists
    */
   u.row.start[0] = 0;

   rring = u.row.elem;

   lastrring = &(u.row.list);

   lastrring->idx = thedim;

   lastrring->next = rring;

   cring = u.col.elem;

   lastcring = &(u.col.list);

   lastcring->idx = thedim;

   lastcring->next = cring;

   m = 0;

   for(int i = 0; i < thedim; i++)
   {
      u.row.start[i] = m;
      m += u.row.max[i];

      rring->idx = i;
      rring->prev = lastrring;
      lastrring->next = rring;
      lastrring = rring;
      ++rring;

      cring->idx = i;
      cring->prev = lastcring;
      lastcring->next = cring;
      lastcring = cring;
      ++cring;
   }

   u.row.start[thedim]       = 0;

   u.row.max[thedim]       = 0;
   u.row.used = m;

   lastrring->next = &(u.row.list);
   lastrring->next->prev = lastrring;

   lastcring->next = &(u.col.list);
   lastcring->next->prev = lastcring;

   /*  Copy matrix to row and column file
    *  excluding and marking column singletons!
    */
   m = 0;
   temp.stage = 0;

   initMaxabs = 0;

   for(int i = 0; i < thedim; i++)
   {
      int nnonzeros;

      psv = vec[i];
      u.col.start[i] = m;

      /* check whether number of nonzeros above tolerance is 0, 1 or >= 2 */
      nnonzeros = 0;

      for(int j = 0; j < psv->size() && nnonzeros <= 1; j++)
      {
         if(isNotZero(psv->value(j), eps))
            nnonzeros++;
      }

      /* basis is singular due to empty column */
      if(nnonzeros == 0)
      {
         this->stat = SLinSolver<R>::SINGULAR;
         return;
      }

      /* exclude column singletons */
      else if(nnonzeros == 1)
      {
         int j = 0;

         /* find nonzero */

         for(j = 0; isZero(psv->value(j), eps); j++)
            ;

         assert(j < psv->size());

         /* basis is singular due to two linearly dependent column singletons */
         if(row.perm[psv->index(j)] >= 0)
         {
            this->stat = SLinSolver<R>::SINGULAR;
            return;
         }

         /* update maximum absolute nonzero value */
         x = psv->value(j);

         if(spxAbs(x) > initMaxabs)
            initMaxabs = spxAbs(x);

         /* permute to front and mark as singleton */
         setPivot(temp.stage, i, psv->index(j), x);

         sing[temp.stage] = i;

         temp.stage++;

         /* set column length to zero */
         temp.s_cact[i] = u.col.len[i] = u.col.max[i] = 0;
      }

      /* add to active matrix if not a column singleton */
      else
      {
         int end;
         int k;

         /* go through all nonzeros in column */
         assert(nnonzeros >= 2);
         nnonzeros = 0;

         for(int j = 0; j < psv->size(); j++)
         {
            x = psv->value(j);

            if(isNotZero(x, eps))
            {
               /* add to column array */
               k = psv->index(j);
               u.col.idx[m] = k;
               m++;

               /* add to row array */
               end = u.row.start[k] + u.row.len[k];
               u.row.idx[end] = i;
               u.row.val[end] = x;
               u.row.len[k]++;

               /* update maximum absolute nonzero value */

               if(spxAbs(x) > initMaxabs)
                  initMaxabs = spxAbs(x);

               nnonzeros++;
            }
         }

         assert(nnonzeros >= 2);

         /* set column length */
         temp.s_cact[i] = u.col.len[i] = u.col.max[i] = nnonzeros;
      }
   }

   u.col.used = m;
}